

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O0

void __thiscall
duckdb::ChimpGroupState<unsigned_long>::LoadLeadingZeros
          (ChimpGroupState<unsigned_long> *this,uint8_t *packed_data,idx_t leading_zero_block_size)

{
  byte bVar1;
  ulong in_RDX;
  uint8_t *in_RSI;
  undefined4 *in_RDI;
  idx_t i;
  LeadingZeroBuffer<false> leading_zero_buffer;
  ulong local_30;
  LeadingZeroBuffer<false> *in_stack_ffffffffffffffe0;
  
  LeadingZeroBuffer<false>::LeadingZeroBuffer((LeadingZeroBuffer<false> *)&stack0xffffffffffffffd8);
  LeadingZeroBuffer<false>::SetBuffer((LeadingZeroBuffer<false> *)&stack0xffffffffffffffd8,in_RSI);
  for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
    bVar1 = LeadingZeroBuffer<false>::Extract(in_stack_ffffffffffffffe0);
    *(undefined1 *)((long)in_RDI + local_30 + 0x409) =
         *(undefined1 *)
          ((long)&ChimpConstants::Decompression::LEADING_REPRESENTATION + (ulong)bVar1);
  }
  *(ulong *)(in_RDI + 0xd06) = in_RDX;
  *in_RDI = 0;
  return;
}

Assistant:

void LoadLeadingZeros(uint8_t *packed_data, idx_t leading_zero_block_size) {
#ifdef DEBUG
		idx_t flag_one_count = 0;
		for (idx_t i = 0; i < max_flags_to_read; i++) {
			flag_one_count += flags[1 + i] == ChimpConstants::Flags::LEADING_ZERO_LOAD;
		}
		// There are 8 leading zero values packed in one block, the block could be partially filled
		flag_one_count = AlignValue<idx_t, 8>(flag_one_count);
		D_ASSERT(flag_one_count == leading_zero_block_size);
#endif
		LeadingZeroBuffer<false> leading_zero_buffer;
		leading_zero_buffer.SetBuffer(packed_data);
		for (idx_t i = 0; i < leading_zero_block_size; i++) {
			leading_zeros[i] = ChimpConstants::Decompression::LEADING_REPRESENTATION[leading_zero_buffer.Extract()];
		}
		max_leading_zeros_to_read = leading_zero_block_size;
		leading_zero_index = 0;
	}